

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O1

void __thiscall
hypermind::CompileUnit::EmitCall(CompileUnit *this,HMInteger methodIndex,HMInteger argNum)

{
  HMFunction *pHVar1;
  VM *pVVar2;
  FunctionDebug *pFVar3;
  uint uVar4;
  HMUINT32 HVar5;
  char *pcVar6;
  uint *puVar7;
  uint uVar8;
  size_t oldSize;
  
  uVar4 = this->mStackSlotNum - argNum;
  this->mStackSlotNum = uVar4;
  pHVar1 = this->mFn;
  if (pHVar1->maxStackSlotNum < uVar4) {
    pHVar1->maxStackSlotNum = uVar4;
  }
  if (argNum < 8) {
    uVar4 = (pHVar1->instructions).capacity;
    uVar8 = (pHVar1->instructions).count + 1;
    if (uVar4 < uVar8) {
      pVVar2 = this->mVM;
      HVar5 = CeilToPowerOf2(uVar8);
      (pHVar1->instructions).capacity = HVar5;
      pcVar6 = (char *)GCHeap::MemManger(&pVVar2->mGCHeap,(pHVar1->instructions).data,(ulong)uVar4,
                                         (ulong)HVar5);
      (pHVar1->instructions).data = pcVar6;
    }
    uVar4 = (pHVar1->instructions).count;
    (pHVar1->instructions).count = uVar4 + 1;
    (pHVar1->instructions).data[uVar4] = (char)argNum + '\x10';
    pFVar3 = this->mFn->debug;
    uVar4 = (pFVar3->line).capacity;
    uVar8 = (pFVar3->line).count + 1;
    if (uVar4 < uVar8) {
      pVVar2 = this->mVM;
      HVar5 = CeilToPowerOf2(uVar8);
      (pFVar3->line).capacity = HVar5;
      puVar7 = (uint *)GCHeap::MemManger(&pVVar2->mGCHeap,(pFVar3->line).data,(ulong)uVar4 << 2,
                                         (ulong)HVar5 << 2);
      (pFVar3->line).data = puVar7;
    }
    uVar4 = this->mLine;
    uVar8 = (pFVar3->line).count;
    (pFVar3->line).count = uVar8 + 1;
    (pFVar3->line).data[uVar8] = uVar4;
  }
  else {
    WriteOpcode(this,Call);
    WriteShortOperand(this,methodIndex);
    methodIndex = argNum;
  }
  WriteShortOperand(this,methodIndex);
  return;
}

Assistant:

void EmitCall(HMInteger methodIndex, HMInteger argNum) {
            STACK_CHANGE(-argNum);
            if (argNum <= 7) {
                WriteByte(static_cast<HMByte>((HMByte) Opcode::Call0 + argNum));
                WriteShortOperand(methodIndex);
            } else {
                WriteOpcode(Opcode::Call);
                WriteShortOperand(methodIndex); // 方法索引
                WriteShortOperand(argNum); // 实参数量
            }
        }